

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

_Bool gnode_is_equal(gnode_t *node1,gnode_t *node2)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  gnode_n gVar4;
  gnode_base_t *_node2;
  gnode_base_t *_node1;
  
  if ((node1->tag != node2->tag) || (node1->tag != NODE_LITERAL_EXPR)) goto LAB_00137f4a;
  gVar4 = node1[1].tag;
  if (gVar4 != node2[1].tag) {
    bVar1 = false;
    gVar4 = NODE_LIST_STAT;
    goto LAB_00137f46;
  }
  switch(gVar4) {
  case NODE_LIST_STAT:
    iVar3 = strcmp(*(char **)&node1[1].block_length,*(char **)&node2[1].block_length);
    gVar4 = (gnode_n)(iVar3 == 0);
    bVar1 = false;
    break;
  case NODE_COMPOUND_STAT:
    gVar4 = -(uint)(*(double *)&node2[1].block_length == *(double *)&node1[1].block_length) &
            NODE_COMPOUND_STAT;
    goto LAB_00137f40;
  case NODE_LABEL_STAT:
  case NODE_FLOW_STAT:
    gVar4 = (gnode_n)(*(long *)&node1[1].block_length == *(long *)&node2[1].block_length);
LAB_00137f40:
    bVar1 = false;
    break;
  default:
    bVar1 = true;
  }
LAB_00137f46:
  bVar2 = (byte)gVar4;
  if (bVar1) {
LAB_00137f4a:
    bVar2 = 0;
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool gnode_is_equal (gnode_t *node1, gnode_t *node2) {
    // very simple gnode verification for map key uniqueness
    gnode_base_t *_node1 = (gnode_base_t *)node1;
    gnode_base_t *_node2 = (gnode_base_t *)node2;
    if (_node1->base.tag != _node2->base.tag) return false;
    if (gnode_is_literal(node1)) {
        gnode_literal_expr_t *e1 = (gnode_literal_expr_t *)node1;
        gnode_literal_expr_t *e2 = (gnode_literal_expr_t *)node2;
        if (e1->type != e2->type) return false;
        // LITERAL_STRING, LITERAL_FLOAT, LITERAL_INT, LITERAL_BOOL, LITERAL_STRING_INTERPOLATED
        if (e1->type == LITERAL_BOOL) return (e1->value.n64 == e2->value.n64);
        if (e1->type == LITERAL_INT) return (e1->value.n64 == e2->value.n64);
        if (e1->type == LITERAL_FLOAT) return (e1->value.d == e2->value.d);
        if (e1->type == LITERAL_STRING) return (strcmp(e1->value.str, e2->value.str)==0);
        // there is no way to check node equality for a LITERAL_STRING_INTERPOLATED at compile time
    }
    return false;
}